

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::ClientImpl::process_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  bool bVar1;
  int iVar2;
  __ssize_t _Var3;
  key_type *beg;
  Response *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  Stream *__lineptr;
  char *__s;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar4;
  int dummy_status;
  char buf [2048];
  undefined1 local_8b8 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_878;
  code *local_868;
  code *local_860;
  _Any_data local_858;
  code *local_848;
  code *local_840;
  key_type local_838 [64];
  
  bVar1 = write_request(this,strm,req,close_connection,error);
  if (!bVar1) {
    return false;
  }
  __stream = res;
  __lineptr = strm;
  bVar1 = read_response_line(this,strm,req,res);
  if (!bVar1) {
LAB_0010f5ca:
    *error = Read;
    return false;
  }
  local_8b8._8_8_ = local_838;
  local_8b8._16_8_ = 0x800;
  local_8b8._24_8_ = (Response *)0x0;
  local_8b8._40_8_ = (Response *)0x0;
  local_8b8[0x30] = '\0';
  __n = extraout_RDX;
  local_8b8._0_8_ = strm;
  local_8b8._32_8_ = (key_type *)(local_8b8 + 0x30);
  while( true ) {
    _Var3 = detail::stream_line_reader::getline
                      ((stream_line_reader *)local_8b8,(char **)__lineptr,__n,(FILE *)__stream);
    if ((char)_Var3 == '\0') break;
    beg = (key_type *)local_8b8._32_8_;
    __stream = (Response *)local_8b8._40_8_;
    if ((Response *)local_8b8._40_8_ == (Response *)0x0) {
      beg = (key_type *)local_8b8._8_8_;
      __stream = (Response *)local_8b8._24_8_;
    }
    __n = extraout_RDX_00;
    if ((((Response *)0x1 < __stream) &&
        (__lineptr = (Stream *)
                     ((long)&(beg->_M_dataplus)._M_p + (long)&(__stream->version)._M_dataplus),
        *(char *)((long)&__lineptr[-1]._vptr_Stream + 6) == '\r')) &&
       (*(char *)((long)&__lineptr[-1]._vptr_Stream + 7) == '\n')) {
      if (__stream == (Response *)0x2) break;
      __lineptr = (Stream *)((long)&__lineptr[-1]._vptr_Stream + 6);
      detail::
      parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                ((char *)beg,(char *)__lineptr,(anon_class_8_1_b2c1a266)&res->headers);
      __n = extraout_RDX_01;
    }
  }
  if ((key_type *)local_8b8._32_8_ != (key_type *)(local_8b8 + 0x30)) {
    operator_delete((void *)local_8b8._32_8_,CONCAT71(local_8b8._49_7_,local_8b8[0x30]) + 1);
  }
  if ((char)_Var3 == '\0') goto LAB_0010f5ca;
  if (((req->response_handler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar1 = (*(req->response_handler_)._M_invoker)((_Any_data *)&req->response_handler_,res),
     !bVar1)) {
    *error = Canceled;
    return false;
  }
  if ((res->status != 0xcc) &&
     ((iVar2 = std::__cxx11::string::compare((char *)req), iVar2 != 0 &&
      (iVar2 = std::__cxx11::string::compare((char *)req), iVar2 != 0)))) {
    if ((req->content_receiver_).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_868 = std::
                  _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5708:8)>
                  ::_M_manager;
      local_860 = std::
                  _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5708:8)>
                  ::_M_invoke;
      local_878._8_8_ = (Error *)0x0;
      local_878._M_allocated_capacity = (size_type)res;
    }
    else {
      local_868 = std::
                  _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5702:8)>
                  ::_M_manager;
      local_860 = std::
                  _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5702:8)>
                  ::_M_invoke;
      local_878._8_8_ = error;
      local_878._M_allocated_capacity = (size_type)req;
    }
    local_840 = std::
                _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5717:20)>
                ::_M_invoke;
    local_848 = std::
                _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5717:20)>
                ::_M_manager;
    local_838[0].field_2._M_allocated_capacity = (code *)0x0;
    local_838[0].field_2._8_8_ = 0;
    local_858._M_unused._M_object = req;
    local_858._8_8_ = error;
    local_838[0]._M_dataplus._M_p = (pointer)local_878._M_allocated_capacity;
    local_838[0]._M_string_length = local_878._8_8_;
    bVar1 = detail::read_content<httplib::Response>
                      (strm,res,0xffffffffffffffff,(int *)local_8b8,(Progress *)&local_858,
                       (ContentReceiverWithProgress *)&local_878,this->decompress_);
    if (local_868 != (code *)0x0) {
      (*local_868)((_Any_data *)&local_878,(_Any_data *)&local_878,__destroy_functor);
    }
    if (local_848 != (code *)0x0) {
      (*local_848)(&local_858,&local_858,__destroy_functor);
    }
    if (*error != Canceled && !bVar1) {
      *error = Read;
    }
    if ((code *)local_838[0].field_2._0_8_ != (code *)0x0) {
      (*(code *)local_838[0].field_2._0_8_)(local_838,local_838,3);
    }
    if (!bVar1) {
      return false;
    }
  }
  local_838[0]._M_dataplus._M_p = (pointer)&local_838[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"Connection","");
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(res->headers)._M_t,local_838);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838[0]._M_dataplus._M_p != &local_838[0].field_2) {
    operator_delete(local_838[0]._M_dataplus._M_p,
                    (ulong)(local_838[0].field_2._M_allocated_capacity + 1));
  }
  if (pVar4.first._M_node._M_node == pVar4.second._M_node._M_node) {
    __s = "";
  }
  else {
    __s = *(char **)(pVar4.first._M_node._M_node + 2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_8b8,__s,(allocator<char> *)local_838);
  iVar2 = std::__cxx11::string::compare((char *)local_8b8);
  if (iVar2 == 0) {
    if ((Stream *)local_8b8._0_8_ != (Stream *)(local_8b8 + 0x10)) {
      operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)res);
    if (iVar2 != 0) {
      if ((Stream *)local_8b8._0_8_ != (Stream *)(local_8b8 + 0x10)) {
        operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
      }
      goto LAB_0010f826;
    }
    iVar2 = std::__cxx11::string::compare((char *)&res->reason);
    if ((Stream *)local_8b8._0_8_ != (Stream *)(local_8b8 + 0x10)) {
      operator_delete((void *)local_8b8._0_8_,local_8b8._16_8_ + 1);
    }
    if (iVar2 == 0) goto LAB_0010f826;
  }
  lock_socket_and_shutdown_and_close(this);
LAB_0010f826:
  if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->logger_)._M_invoker)((_Any_data *)&this->logger_,req,res);
    return true;
  }
  return true;
}

Assistant:

inline bool ClientImpl::process_request(Stream &strm, const Request &req,
											Response &res, bool close_connection,
											Error &error) {
		// Send request
		if (!write_request(strm, req, close_connection, error)) { return false; }

		// Receive response and headers
		if (!read_response_line(strm, req, res) ||
			!detail::read_headers(strm, res.headers)) {
			error = Error::Read;
			return false;
		}

		if (req.response_handler_) {
			if (!req.response_handler_(res)) {
				error = Error::Canceled;
				return false;
			}
		}

		// Body
		if ((res.status != 204) && req.method != "HEAD" && req.method != "CONNECT") {
			auto out =
					req.content_receiver_
					? static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t off, uint64_t len) {
								auto ret = req.content_receiver_(buf, n, off, len);
								if (!ret) { error = Error::Canceled; }
								return ret;
							})
					: static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t /*off*/,
								uint64_t /*len*/) {
								if (res.body.size() + n > res.body.max_size()) {
									return false;
								}
								res.body.append(buf, n);
								return true;
							});

			auto progress = [&](uint64_t current, uint64_t total) {
				if (!req.progress_) { return true; }
				auto ret = req.progress_(current, total);
				if (!ret) { error = Error::Canceled; }
				return ret;
			};

			int dummy_status;
			if (!detail::read_content(strm, res, (std::numeric_limits<size_t>::max)(),
									  dummy_status, std::move(progress), std::move(out),
									  decompress_)) {
				if (error != Error::Canceled) { error = Error::Read; }
				return false;
			}
		}

		if (res.get_header_value("Connection") == "close" ||
			(res.version == "HTTP/1.0" && res.reason != "Connection established")) {
			// TODO this requires a not-entirely-obvious chain of calls to be correct
			// for this to be safe. Maybe a code refactor (such as moving this out to
			// the send function and getting rid of the recursiveness of the mutex)
			// could make this more obvious.

			// This is safe to call because process_request is only called by
			// handle_request which is only called by send, which locks the request
			// mutex during the process. It would be a bug to call it from a different
			// thread since it's a thread-safety issue to do these things to the socket
			// if another thread is using the socket.
			lock_socket_and_shutdown_and_close();
		}

		// Log
		if (logger_) { logger_(req, res); }

		return true;
	}